

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *s,QRect *r)

{
  long lVar1;
  int iVar2;
  qint32 *in_RSI;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  qint32 y2_1;
  qint32 x2_1;
  qint32 y1_1;
  qint32 x1_1;
  qint16 y2;
  qint16 x2;
  qint16 y1;
  qint16 x1;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = QDataStream::version(in_RDI);
  if (iVar2 == 1) {
    QDataStream::operator>>(in_RDI,(qint16 *)in_RSI);
    QDataStream::operator>>(in_RDI,(qint16 *)in_RSI);
    QDataStream::operator>>(in_RDI,(qint16 *)in_RSI);
    QDataStream::operator>>(in_RDI,(qint16 *)in_RSI);
    QRect::setCoords((QRect *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20),
                     (int)in_RSI);
  }
  else {
    uVar4 = 0xaaaaaaaa;
    uVar3 = 0xaaaaaaaa;
    QDataStream::operator>>(in_RDI,in_RSI);
    QDataStream::operator>>(in_RDI,in_RSI);
    QDataStream::operator>>(in_RDI,in_RSI);
    QDataStream::operator>>(in_RDI,in_RSI);
    QRect::setCoords((QRect *)CONCAT44(uVar4,uVar3),(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     (int)((ulong)in_RSI >> 0x20),(int)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &s, QRect &r)
{
    if (s.version() == 1) {
        qint16 x1, y1, x2, y2;
        s >> x1; s >> y1; s >> x2; s >> y2;
        r.setCoords(x1, y1, x2, y2);
    }
    else {
        qint32 x1, y1, x2, y2;
        s >> x1; s >> y1; s >> x2; s >> y2;
        r.setCoords(x1, y1, x2, y2);
    }
    return s;
}